

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule(cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar2;
  size_t __n;
  const_iterator __position;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  cmGlobalNinjaGenerator *pcVar6;
  string *psVar7;
  char *pcVar8;
  pointer pbVar9;
  undefined4 extraout_var;
  long lVar10;
  cmOutputConverter *outputConverter;
  string *linkCmd;
  string responseFlag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string cmakeLinkVar;
  string linkRuleName;
  string cmakeVarLang;
  string targetVersionMinor;
  string targetVersionMajor;
  int major;
  cmNinjaRule rule;
  string langFlags;
  string launcher;
  string local_6e0;
  TargetType local_6bc;
  undefined1 local_6b8 [32];
  cmRulePlaceholderExpander *local_698;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_690;
  string local_678;
  string local_658;
  long *local_638;
  long local_630;
  long local_628 [2];
  char *local_618;
  undefined8 local_610;
  char local_608;
  undefined7 uStack_607;
  char *local_5f8;
  undefined8 local_5f0;
  char local_5e8;
  undefined7 uStack_5e7;
  char *local_5d8;
  size_type local_5d0;
  char local_5c8;
  undefined7 uStack_5c7;
  undefined8 uStack_5c0;
  char *local_5b8;
  size_type local_5b0;
  char local_5a8;
  undefined7 uStack_5a7;
  undefined8 uStack_5a0;
  string local_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_578;
  undefined8 local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  undefined1 local_558 [32];
  _Alloc_hider local_538;
  size_type local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  _Alloc_hider local_518;
  char *local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  _Alloc_hider local_4f8;
  char *local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  _Alloc_hider local_4d8;
  size_type local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  _Alloc_hider local_4b8;
  size_type local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  _Alloc_hider local_498;
  char *local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  _Alloc_hider local_478;
  char *local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  _Alloc_hider local_458;
  char *local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  bool local_438;
  undefined1 local_430 [32];
  char *local_410;
  char *local_408;
  pointer local_400;
  char *local_3f0;
  char *local_3e8;
  char *local_3b8;
  char *local_3a8;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 local_320 [32];
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  char *local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  char *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  _Alloc_hider local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Alloc_hider local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  _Alloc_hider local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  bool local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_6bc = cmGeneratorTarget::GetType
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget);
  LanguageLinkerRule_abi_cxx11_(&local_658,this);
  pcVar6 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar4 = cmGlobalNinjaGenerator::HasRule(pcVar6,&local_658);
  sVar3 = local_658._M_string_length;
  if (bVar4) goto LAB_0029bd01;
  local_578 = &local_568;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p == &local_658.field_2) {
    local_568._8_8_ = local_658.field_2._8_8_;
    local_658._M_dataplus._M_p = (pointer)local_578;
  }
  local_568._M_allocated_capacity._1_7_ = local_658.field_2._M_allocated_capacity._1_7_;
  local_568._M_local_buf[0] = local_658.field_2._M_local_buf[0];
  local_658._M_string_length = 0;
  local_658.field_2._M_local_buf[0] = '\0';
  local_558._0_8_ = local_658._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p == local_578) {
    local_558._24_8_ = local_568._8_8_;
    local_558._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_558 + 0x10);
  }
  local_558._16_8_ = local_568._M_allocated_capacity;
  local_538._M_p = (pointer)&local_528;
  local_558._8_8_ = sVar3;
  local_570 = 0;
  local_568._M_allocated_capacity = (ulong)(uint7)local_658.field_2._M_allocated_capacity._1_7_ << 8
  ;
  local_530 = 0;
  local_528._M_local_buf[0] = '\0';
  local_518._M_p = (pointer)&local_508;
  local_510 = (char *)0x0;
  local_508._M_local_buf[0] = '\0';
  local_4f8._M_p = (pointer)&local_4e8;
  local_4f0 = (char *)0x0;
  local_4e8._M_local_buf[0] = '\0';
  local_4d8._M_p = (pointer)&local_4c8;
  local_4d0 = 0;
  local_4c8._M_local_buf[0] = '\0';
  local_4b8._M_p = (pointer)&local_4a8;
  local_4b0 = 0;
  local_4a8._M_local_buf[0] = '\0';
  local_498._M_p = (pointer)&local_488;
  local_490 = (char *)0x0;
  local_488._M_local_buf[0] = '\0';
  local_478._M_p = (pointer)&local_468;
  local_470 = (char *)0x0;
  local_468._M_local_buf[0] = '\0';
  local_458._M_p = (pointer)&local_448;
  local_450 = (char *)0x0;
  local_448._M_local_buf[0] = '\0';
  local_438 = false;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_430);
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  local_430._0_8_ = (psVar7->_M_dataplus)._M_p;
  local_430._8_8_ = cmState::GetTargetTypeName(local_6bc);
  psVar7 = &this->TargetLinkLanguage;
  local_400 = (this->TargetLinkLanguage)._M_dataplus._M_p;
  iVar5 = std::__cxx11::string::compare((char *)psVar7);
  if (iVar5 == 0) {
    local_348 = "$SWIFT_LIBRARY_NAME";
    local_340 = "$SWIFT_MODULE";
    local_338 = "$SWIFT_MODULE_NAME";
    local_330 = "$SWIFT_OUTPUT_FILE_MAP";
    local_328 = "$SWIFT_SOURCES";
    local_368 = "$DEFINES";
    local_3a8 = "$FLAGS";
    local_360 = "$INCLUDES";
  }
  local_6b8._0_8_ = local_6b8 + 0x10;
  local_6b8._8_8_ = (pointer)0x0;
  local_6b8._16_8_ = local_6b8._16_8_ & 0xffffffffffffff00;
  local_638 = local_628;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"CMAKE_","");
  std::__cxx11::string::_M_append
            ((char *)&local_638,(ulong)(this->TargetLinkLanguage)._M_dataplus._M_p);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_678,local_638,local_630 + (long)local_638);
  std::__cxx11::string::append((char *)&local_678);
  pcVar8 = cmMakefile::GetDefinition
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                      &local_678);
  pbVar9 = (pointer)local_6b8._8_8_;
  if (pcVar8 == (char *)0x0) {
    iVar5 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar5 != 0) {
      pcVar8 = "@";
      pbVar9 = (pointer)local_6b8._8_8_;
      goto LAB_0029b553;
    }
  }
  else {
    strlen(pcVar8);
LAB_0029b553:
    std::__cxx11::string::_M_replace((ulong)local_6b8,0,(char *)pbVar9,(ulong)pcVar8);
  }
  pcVar8 = "$LINK_PATH $LINK_LIBRARIES";
  lVar10 = 0x38;
  pbVar9 = (pointer)0x530069;
  if ((useResponseFile) && ((pointer)local_6b8._8_8_ != (pointer)0x0)) {
    std::__cxx11::string::_M_replace((ulong)&local_498,0,local_490,0x52fde1);
    std::__cxx11::string::_M_append(local_6b8,(ulong)local_498._M_p);
    pcVar6 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar8 = "$in_newline";
    if (pcVar6->UsingGCCOnWindows != false) {
      pcVar8 = "$in";
    }
    std::__cxx11::string::_M_replace((ulong)&local_478,0,local_470,(ulong)pcVar8);
    std::__cxx11::string::append((char *)&local_478);
    iVar5 = std::__cxx11::string::compare((char *)psVar7);
    lVar10 = 0x38;
    if (iVar5 == 0) {
      lVar10 = 0x108;
    }
    pcVar8 = "";
    pbVar9 = (pointer)local_6b8._0_8_;
  }
  *(pointer *)(local_430 + lVar10) = pbVar9;
  local_3b8 = "$OBJECT_DIR";
  local_3f0 = "$TARGET_FILE";
  local_398 = "$SONAME_FLAG";
  local_390 = "$SONAME";
  local_388 = "$INSTALLNAME_DIR";
  local_430._16_8_ = "$TARGET_PDB";
  local_5f8 = &local_5e8;
  local_5f0 = 0;
  local_5e8 = '\0';
  local_618 = &local_608;
  local_610 = 0;
  local_608 = '\0';
  local_3e8 = pcVar8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  cmGeneratorTarget::GetTargetVersion
            ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             (int *)&local_598,(int *)&local_690);
  std::ostream::operator<<(local_320,(int)local_598._M_dataplus._M_p);
  std::ostream::operator<<
            (local_1a8,
             (int)local_690.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_5f8,(string *)&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_618,(string *)&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)local_2b0._M_local_buf);
  local_410 = local_5f8;
  local_408 = local_618;
  local_3a8 = "$FLAGS";
  local_380 = "$LINK_FLAGS";
  local_378 = "$MANIFESTS";
  local_320._0_8_ = local_320 + 0x10;
  local_320._8_8_ = 0;
  local_320._16_8_ = local_320._16_8_ & 0xffffffffffffff00;
  if (local_6bc != EXECUTABLE) {
    std::__cxx11::string::append(local_320);
    local_370 = (char *)local_320._0_8_;
  }
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  local_1a8[0]._M_string_length = 0;
  local_1a8[0].field_2._M_local_buf[0] = '\0';
  target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"RULE_LAUNCH_LINK","");
  pcVar8 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar2,target,&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  sVar3 = local_1a8[0]._M_string_length;
  if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)local_1a8,0,(char *)sVar3,(ulong)pcVar8);
    std::__cxx11::string::append((char *)local_1a8);
  }
  iVar5 = (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
            super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
  local_698 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar5);
  ComputeLinkCmd_abi_cxx11_(&local_690,this);
  psVar7 = (string *)
           CONCAT44(local_690.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (int)local_690.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  if (psVar7 != local_690.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::operator+(&local_6e0,local_1a8,psVar7);
      std::__cxx11::string::operator=((string *)psVar7,(string *)&local_6e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      outputConverter =
           &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      if (pcVar2 == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (local_698,outputConverter,psVar7,(RuleVariables *)local_430);
      psVar7 = psVar7 + 1;
    } while (psVar7 != local_690.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
            (&local_690);
  __position._M_current._4_4_ =
       local_690.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  __position._M_current._0_4_ =
       (int)local_690.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"$PRE_LINK","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&local_690,__position,&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_690,
             (char (*) [12])"$POST_BUILD");
  local_598._M_string_length = 0;
  local_598.field_2._M_local_buf[0] = '\0';
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_6e0,(this->super_cmNinjaTargetGenerator).LocalGenerator,&local_690,&local_598,
             (cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&local_538,(string *)&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,
                    CONCAT71(local_598.field_2._M_allocated_capacity._1_7_,
                             local_598.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_4f8,0,local_4f0,0x530386);
  std::__cxx11::string::_M_append
            ((char *)&local_4f8,(ulong)(this->TargetLinkLanguage)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_4f8);
  GetVisibleTypeName(this);
  std::__cxx11::string::append((char *)&local_4f8);
  std::__cxx11::string::append((char *)&local_4f8);
  std::__cxx11::string::_M_replace((ulong)&local_518,0,local_510,0x530398);
  std::__cxx11::string::_M_append
            ((char *)&local_518,(ulong)(this->TargetLinkLanguage)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_518);
  GetVisibleTypeName(this);
  std::__cxx11::string::append((char *)&local_518);
  std::__cxx11::string::append((char *)&local_518);
  std::__cxx11::string::_M_replace((ulong)&local_458,0,local_450,0x5303a1);
  pcVar6 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar6,(cmNinjaRule *)local_558);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_690);
  if (local_698 != (cmRulePlaceholderExpander *)0x0) {
    std::default_delete<cmRulePlaceholderExpander>::operator()
              ((default_delete<cmRulePlaceholderExpander> *)&local_698,local_698);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                             local_1a8[0].field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if (local_618 != &local_608) {
    operator_delete(local_618,CONCAT71(uStack_607,local_608) + 1);
  }
  if (local_5f8 != &local_5e8) {
    operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if (local_638 != local_628) {
    operator_delete(local_638,local_628[0] + 1);
  }
  if ((pointer)local_6b8._0_8_ != (pointer)(local_6b8 + 0x10)) {
    operator_delete((void *)local_6b8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_6b8._16_8_)->_M_p + 1));
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_558);
LAB_0029bd01:
  __n = (this->TargetNames).Output._M_string_length;
  if (((__n != (this->TargetNames).Real._M_string_length) ||
      ((__n != 0 &&
       (iVar5 = bcmp((this->TargetNames).Output._M_dataplus._M_p,
                     (this->TargetNames).Real._M_dataplus._M_p,__n), iVar5 != 0)))) &&
     (bVar4 = cmGeneratorTarget::IsFrameworkOnApple
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget), !bVar4)) {
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (local_1a8,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar7,SHELL);
    if (local_6bc == EXECUTABLE) {
      local_5b8 = &local_5a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_5b8,"CMAKE_SYMLINK_EXECUTABLE","");
      local_320._0_8_ = local_320 + 0x10;
      if (local_5b8 == &local_5a8) {
        local_320._24_8_ = uStack_5a0;
      }
      else {
        local_320._0_8_ = local_5b8;
      }
      local_320._17_7_ = uStack_5a7;
      local_320[0x10] = local_5a8;
      local_300._M_p = (pointer)&local_2f0;
      local_320._8_8_ = local_5b0;
      local_5b0 = 0;
      local_5a8 = '\0';
      local_2f8 = 0;
      local_2f0._M_local_buf[0] = '\0';
      local_2e0._M_p = (pointer)&local_2d0;
      local_2d8 = (char *)0x0;
      local_2d0._M_local_buf[0] = '\0';
      local_2c0._M_p = (pointer)&local_2b0;
      local_2b8 = (char *)0x0;
      local_2b0._M_local_buf[0] = '\0';
      local_2a0._M_p = (pointer)&local_290;
      local_298 = 0;
      local_290._M_local_buf[0] = '\0';
      local_280._M_p = (pointer)&local_270;
      local_278 = 0;
      local_270._M_local_buf[0] = '\0';
      local_260._M_p = (pointer)&local_250;
      local_258 = 0;
      local_250._M_local_buf[0] = '\0';
      local_240._M_p = (pointer)&local_230;
      local_238 = 0;
      local_230._M_local_buf[0] = '\0';
      local_220._M_p = (pointer)&local_210;
      local_218 = 0;
      local_210._M_local_buf[0] = '\0';
      local_200 = false;
      local_6b8._16_8_ = (pointer)0x0;
      local_6b8._0_8_ = (pointer)0x0;
      local_6b8._8_8_ = (pointer)0x0;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_558 + 0x10);
      local_5b8 = &local_5a8;
      local_558._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_558,local_1a8[0]._M_dataplus._M_p,
                 (char *)(local_1a8[0]._M_string_length + (long)local_1a8[0]._M_dataplus._M_p));
      std::__cxx11::string::append(local_558);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_6b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._0_8_ != paVar1) {
        operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_6b8,
                 (char (*) [12])"$POST_BUILD");
      local_430._8_8_ = (char *)0x0;
      local_430._16_8_ = local_430._16_8_ & 0xffffffffffffff00;
      local_430._0_8_ = local_430 + 0x10;
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)local_558,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_6b8,(string *)local_430,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&local_300,(string *)local_558);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._0_8_ != paVar1) {
        operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
      }
      if ((undefined1 *)local_430._0_8_ != local_430 + 0x10) {
        operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_6b8);
      std::__cxx11::string::_M_replace((ulong)&local_2e0,0,local_2d8,0x530486);
      std::__cxx11::string::_M_replace((ulong)&local_2c0,0,local_2b8,0x5304a7);
      pcVar6 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar6,(cmNinjaRule *)local_320);
    }
    else {
      local_5d8 = &local_5c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_5d8,"CMAKE_SYMLINK_LIBRARY","");
      local_320._0_8_ = local_320 + 0x10;
      if (local_5d8 == &local_5c8) {
        local_320._24_8_ = uStack_5c0;
      }
      else {
        local_320._0_8_ = local_5d8;
      }
      local_320._17_7_ = uStack_5c7;
      local_320[0x10] = local_5c8;
      local_300._M_p = (pointer)&local_2f0;
      local_320._8_8_ = local_5d0;
      local_5d0 = 0;
      local_5c8 = '\0';
      local_2f8 = 0;
      local_2f0._M_local_buf[0] = '\0';
      local_2e0._M_p = (pointer)&local_2d0;
      local_2d8 = (char *)0x0;
      local_2d0._M_local_buf[0] = '\0';
      local_2c0._M_p = (pointer)&local_2b0;
      local_2b8 = (char *)0x0;
      local_2b0._M_local_buf[0] = '\0';
      local_2a0._M_p = (pointer)&local_290;
      local_298 = 0;
      local_290._M_local_buf[0] = '\0';
      local_280._M_p = (pointer)&local_270;
      local_278 = 0;
      local_270._M_local_buf[0] = '\0';
      local_260._M_p = (pointer)&local_250;
      local_258 = 0;
      local_250._M_local_buf[0] = '\0';
      local_240._M_p = (pointer)&local_230;
      local_238 = 0;
      local_230._M_local_buf[0] = '\0';
      local_220._M_p = (pointer)&local_210;
      local_218 = 0;
      local_210._M_local_buf[0] = '\0';
      local_200 = false;
      local_6b8._16_8_ = (pointer)0x0;
      local_6b8._0_8_ = (pointer)0x0;
      local_6b8._8_8_ = (pointer)0x0;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_558 + 0x10);
      local_5d8 = &local_5c8;
      local_558._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_558,local_1a8[0]._M_dataplus._M_p,
                 (char *)(local_1a8[0]._M_string_length + (long)local_1a8[0]._M_dataplus._M_p));
      std::__cxx11::string::append(local_558);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_6b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._0_8_ != paVar1) {
        operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_6b8,
                 (char (*) [12])"$POST_BUILD");
      local_430._8_8_ = (char *)0x0;
      local_430._16_8_ = local_430._16_8_ & 0xffffffffffffff00;
      local_430._0_8_ = local_430 + 0x10;
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)local_558,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_6b8,(string *)local_430,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&local_300,(string *)local_558);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._0_8_ != paVar1) {
        operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
      }
      if ((undefined1 *)local_430._0_8_ != local_430 + 0x10) {
        operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_6b8);
      std::__cxx11::string::_M_replace((ulong)&local_2e0,0,local_2d8,0x53050e);
      std::__cxx11::string::_M_replace((ulong)&local_2c0,0,local_2b8,0x53052c);
      pcVar6 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar6,(cmNinjaRule *)local_320);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,
                      CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                               local_1a8[0].field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,
                    CONCAT71(local_658.field_2._M_allocated_capacity._1_7_,
                             local_658.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();

  std::string linkRuleName = this->LanguageLinkerRule();
  if (!this->GetGlobalGenerator()->HasRule(linkRuleName)) {
    cmNinjaRule rule(std::move(linkRuleName));
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType = cmState::GetTargetTypeName(targetType);

    vars.Language = this->TargetLinkLanguage.c_str();

    if (this->TargetLinkLanguage == "Swift") {
      vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
      vars.SwiftModule = "$SWIFT_MODULE";
      vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
      vars.SwiftOutputFileMap = "$SWIFT_OUTPUT_FILE_MAP";
      vars.SwiftSources = "$SWIFT_SOURCES";

      vars.Defines = "$DEFINES";
      vars.Flags = "$FLAGS";
      vars.Includes = "$INCLUDES";
    }

    std::string responseFlag;

    std::string cmakeVarLang = "CMAKE_";
    cmakeVarLang += this->TargetLinkLanguage;

    // build response file name
    std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
    const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);

    if (flag) {
      responseFlag = flag;
    } else if (this->TargetLinkLanguage != "CUDA") {
      responseFlag = "@";
    }

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_PATH $LINK_LIBRARIES";
      if (this->TargetLinkLanguage == "Swift") {
        vars.SwiftSources = responseFlag.c_str();
      } else {
        vars.Objects = responseFlag.c_str();
      }
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = launcher + linkCmd;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    rule.Command = this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    rule.Comment = "Rule for linking ";
    rule.Comment += this->TargetLinkLanguage;
    rule.Comment += " ";
    rule.Comment += this->GetVisibleTypeName();
    rule.Comment += ".";
    rule.Description = "Linking ";
    rule.Description += this->TargetLinkLanguage;
    rule.Description += " ";
    rule.Description += this->GetVisibleTypeName();
    rule.Description += " $TARGET_FILE";
    rule.Restat = "$RESTAT";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  if (this->TargetNames.Output != this->TargetNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      cmNinjaRule rule("CMAKE_SYMLINK_EXECUTABLE");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand + " -E cmake_symlink_executable $in $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command = this->GetLocalGenerator()->BuildCommandLine(cmd);
      }
      rule.Description = "Creating executable symlink $out";
      rule.Comment = "Rule for creating executable symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    } else {
      cmNinjaRule rule("CMAKE_SYMLINK_LIBRARY");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand +
                      " -E cmake_symlink_library $in $SONAME $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command = this->GetLocalGenerator()->BuildCommandLine(cmd);
      }
      rule.Description = "Creating library symlink $out";
      rule.Comment = "Rule for creating library symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    }
  }
}